

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int ixxx::posix::ftruncate(int __fd,__off_t __length)

{
  int iVar1;
  ftruncate_error *this;
  int *piVar2;
  
  iVar1 = ::ftruncate(__fd,__length);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (ftruncate_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  ftruncate_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&ftruncate_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void ftruncate(int fd, off_t length)
    {
      int r = ::ftruncate(fd, length);
      if (r == -1)
        throw ftruncate_error(errno);
    }